

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

VkResult Fossilize::CreateRayTracingPipelinesKHR
                   (VkDevice device,VkDeferredOperationKHR deferredOperation,
                   VkPipelineCache pipelineCache,uint32_t createInfoCount,
                   VkRayTracingPipelineCreateInfoKHR *pCreateInfos,VkAllocationCallbacks *pAllocator
                   ,VkPipeline *pPipelines)

{
  bool bVar1;
  Device *this;
  Instance *this_00;
  Device *layer;
  VkAllocationCallbacks *pAllocator_local;
  VkRayTracingPipelineCreateInfoKHR *pCreateInfos_local;
  uint32_t createInfoCount_local;
  VkPipelineCache pipelineCache_local;
  VkDeferredOperationKHR deferredOperation_local;
  VkDevice device_local;
  
  this = get_device_layer(device);
  this_00 = Device::getInstance(this);
  bVar1 = Instance::capturesParanoid(this_00);
  if (bVar1) {
    device_local._4_4_ =
         CreateRayTracingPipelinesParanoid
                   (this,device,deferredOperation,pipelineCache,createInfoCount,pCreateInfos,
                    pAllocator,pPipelines);
  }
  else {
    device_local._4_4_ =
         CreateRayTracingPipelinesNormal
                   (this,device,deferredOperation,pipelineCache,createInfoCount,pCreateInfos,
                    pAllocator,pPipelines);
  }
  return device_local._4_4_;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateRayTracingPipelinesKHR(
		VkDevice device, VkDeferredOperationKHR deferredOperation,
		VkPipelineCache pipelineCache, uint32_t createInfoCount,
		const VkRayTracingPipelineCreateInfoKHR *pCreateInfos,
		const VkAllocationCallbacks *pAllocator,
		VkPipeline *pPipelines)
{
	auto *layer = get_device_layer(device);

	if (layer->getInstance()->capturesParanoid())
	{
		return CreateRayTracingPipelinesParanoid(layer, device, deferredOperation, pipelineCache,
		                                         createInfoCount, pCreateInfos, pAllocator, pPipelines);
	}
	else
	{
		return CreateRayTracingPipelinesNormal(layer, device, deferredOperation, pipelineCache,
		                                       createInfoCount, pCreateInfos, pAllocator, pPipelines);
	}
}